

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::CompactReporter::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  Colour colour;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->stream,";",1);
    Colour::use(FileName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this->stream," expression was:",0x10);
    Colour::use(None);
    printOriginalExpression(this);
    return;
  }
  return;
}

Assistant:

void printExpressionWas() {
                if( result.hasExpression() ) {
                    stream << ";";
                    {
                        Colour colour( dimColour() );
                        stream << " expression was:";
                    }
                    printOriginalExpression();
                }
            }